

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmUnaryOp(LlvmCompilationContext *ctx,ExprUnaryOp *node)

{
  ExpressionContext *pEVar1;
  LLVMValueRef pLVar2;
  LLVMValueRef pLVar3;
  long lVar4;
  TypeStruct *type;
  
  pLVar2 = CompileLlvm(ctx,node->value);
  pLVar3 = (LLVMValueRef)&placeholderValue;
  switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
  case 1:
    pLVar3 = pLVar2;
    if (pLVar2 == (LLVMValueRef)0x0) goto switchD_0025ebb5_default;
    break;
  case 2:
    ExpressionContext::IsIntegerType(ctx->ctx,node->value->type);
    break;
  case 3:
    break;
  case 4:
    type = (TypeStruct *)node->value->type;
    pEVar1 = ctx->ctx;
    if (type == pEVar1->typeAutoRef) {
      type = (TypeStruct *)pEVar1->typeNullPtr;
    }
    else {
      lVar4 = 0x89d8;
      if ((((TypeStruct *)pEVar1->typeBool != type) && ((TypeStruct *)pEVar1->typeChar != type)) &&
         ((TypeStruct *)pEVar1->typeShort != type)) {
        if ((TypeStruct *)pEVar1->typeFloat != type) goto LAB_0025ec4c;
        lVar4 = 0x89f0;
      }
      type = *(TypeStruct **)((long)(pEVar1->uniqueDependencies).little + lVar4 + -0x30);
    }
LAB_0025ec4c:
    CompileLlvmType(ctx,&type->super_TypeBase);
    CompileLlvmType(ctx,ctx->ctx->typeInt);
    break;
  default:
switchD_0025ebb5_default:
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x458,"LLVMValueRef CompileLlvmUnaryOp(LlvmCompilationContext &, ExprUnaryOp *)")
    ;
  }
  pLVar3 = CheckType(ctx,&node->super_ExprBase,pLVar3);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmUnaryOp(LlvmCompilationContext &ctx, ExprUnaryOp *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	LLVMValueRef result = NULL;

	switch(node->op)
	{
	case SYN_UNARY_OP_UNKNOWN:
		break;
	case SYN_UNARY_OP_PLUS:
		result = value;
		break;
	case SYN_UNARY_OP_NEGATE:
		if(ctx.ctx.IsIntegerType(node->value->type))
			result = LLVMBuildNeg(ctx.builder, value, "");
		else
			result = LLVMBuildFNeg(ctx.builder, value, "");
		break;
	case SYN_UNARY_OP_BIT_NOT:
		result = LLVMBuildNot(ctx.builder, value, "");
		break;
	case SYN_UNARY_OP_LOGICAL_NOT:
		if(node->value->type == ctx.ctx.typeAutoRef)
		{
			LLVMValueRef ptr = LLVMBuildExtractValue(ctx.builder, value, 1, "ref_ptr");

			LLVMValueRef rhs = LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr));

			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, ptr, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		}
		else if(isType<TypeRef>(node->value->type))
		{
			LLVMValueRef rhs = LLVMConstPointerNull(CompileLlvmType(ctx, GetStackType(ctx, node->value->type)));

			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, value, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		}
		else
		{
			LLVMValueRef rhs = LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->value->type)), 0, true);

			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, value, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		}
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}